

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

char * __thiscall cmGlobalGenerator::GetPredefinedTargetsFolder(cmGlobalGenerator *this)

{
  cmake *this_00;
  cmState *this_01;
  cmGlobalGenerator *pcVar1;
  allocator local_41;
  string local_40;
  char *prop;
  cmGlobalGenerator *this_local;
  
  prop = (char *)this;
  this_00 = GetCMakeInstance(this);
  this_01 = cmake::GetState(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"PREDEFINED_TARGETS_FOLDER",&local_41);
  pcVar1 = (cmGlobalGenerator *)cmState::GetGlobalProperty(this_01,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  this_local = pcVar1;
  if (pcVar1 == (cmGlobalGenerator *)0x0) {
    this_local = (cmGlobalGenerator *)anon_var_dwarf_263d87;
  }
  return (char *)this_local;
}

Assistant:

const char* cmGlobalGenerator::GetPredefinedTargetsFolder()
{
  const char* prop = this->GetCMakeInstance()->GetState()
                         ->GetGlobalProperty("PREDEFINED_TARGETS_FOLDER");

  if (prop)
    {
    return prop;
    }

  return "CMakePredefinedTargets";
}